

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::AddDefineFlag(cmMakefile *this,char *flag,string *dflags)

{
  long *plVar1;
  char *pcVar2;
  long *plVar3;
  size_type sVar4;
  pointer pcVar5;
  long *plVar6;
  size_type sVar7;
  long local_58;
  long lStack_50;
  long *local_48 [2];
  long local_38 [2];
  
  sVar7 = dflags->_M_string_length;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48," ","");
  plVar1 = (long *)std::__cxx11::string::append((char *)local_48);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_58 = *plVar3;
    lStack_50 = plVar1[3];
    plVar6 = &local_58;
  }
  else {
    local_58 = *plVar3;
    plVar6 = (long *)*plVar1;
  }
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::_M_append((char *)dflags,(ulong)plVar6);
  if (plVar6 != &local_58) {
    operator_delete(plVar6,local_58 + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  pcVar5 = (dflags->_M_dataplus)._M_p;
  sVar4 = dflags->_M_string_length;
  pcVar2 = pcVar5 + sVar7 + 1;
  if (pcVar2 != pcVar5 + sVar4) {
    sVar7 = sVar7 + 1;
    do {
      if (pcVar5[sVar7] == '\n') {
        pcVar5[sVar7] = ' ';
      }
      sVar7 = sVar7 + 1;
    } while (sVar4 != sVar7);
    pcVar5 = (dflags->_M_dataplus)._M_p;
    sVar4 = dflags->_M_string_length;
  }
  for (; pcVar2 != pcVar5 + sVar4; pcVar2 = pcVar2 + 1) {
    if (*pcVar2 == '\r') {
      *pcVar2 = ' ';
    }
  }
  return;
}

Assistant:

void cmMakefile::AddDefineFlag(const char* flag, std::string& dflags)
{
  // remove any \n\r
  std::string::size_type initSize = dflags.size();
  dflags += std::string(" ") + flag;
  std::string::iterator flagStart = dflags.begin() + initSize + 1;
  std::replace(flagStart, dflags.end(), '\n', ' ');
  std::replace(flagStart, dflags.end(), '\r', ' ');
}